

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearObjectStatePdu.cpp
# Opt level: O0

void __thiscall
DIS::LinearObjectStatePdu::unmarshal(LinearObjectStatePdu *this,DataStream *dataStream)

{
  undefined1 local_70 [8];
  LinearSegmentParameter x;
  size_t idx;
  DataStream *dataStream_local;
  LinearObjectStatePdu *this_local;
  
  SyntheticEnvironmentFamilyPdu::unmarshal(&this->super_SyntheticEnvironmentFamilyPdu,dataStream);
  EntityID::unmarshal(&this->_objectID,dataStream);
  EntityID::unmarshal(&this->_referencedObjectID,dataStream);
  DataStream::operator>>(dataStream,&this->_updateNumber);
  DataStream::operator>>(dataStream,&this->_forceID);
  DataStream::operator>>(dataStream,&this->_numberOfSegments);
  SimulationAddress::unmarshal(&this->_requesterID,dataStream);
  SimulationAddress::unmarshal(&this->_receivingID,dataStream);
  ObjectType::unmarshal(&this->_objectType,dataStream);
  std::vector<DIS::LinearSegmentParameter,_std::allocator<DIS::LinearSegmentParameter>_>::clear
            (&this->_linearSegmentParameters);
  x._segmentLength = 0;
  x._segmentWidth = 0;
  x._segmentHeight = 0;
  x._segmentDepth = 0;
  for (; (ulong)x._72_8_ < (ulong)this->_numberOfSegments; x._72_8_ = x._72_8_ + 1) {
    LinearSegmentParameter::LinearSegmentParameter((LinearSegmentParameter *)local_70);
    LinearSegmentParameter::unmarshal((LinearSegmentParameter *)local_70,dataStream);
    std::vector<DIS::LinearSegmentParameter,_std::allocator<DIS::LinearSegmentParameter>_>::
    push_back(&this->_linearSegmentParameters,(value_type *)local_70);
    LinearSegmentParameter::~LinearSegmentParameter((LinearSegmentParameter *)local_70);
  }
  return;
}

Assistant:

void LinearObjectStatePdu::unmarshal(DataStream& dataStream)
{
    SyntheticEnvironmentFamilyPdu::unmarshal(dataStream); // unmarshal information in superclass first
    _objectID.unmarshal(dataStream);
    _referencedObjectID.unmarshal(dataStream);
    dataStream >> _updateNumber;
    dataStream >> _forceID;
    dataStream >> _numberOfSegments;
    _requesterID.unmarshal(dataStream);
    _receivingID.unmarshal(dataStream);
    _objectType.unmarshal(dataStream);

     _linearSegmentParameters.clear();
     for(size_t idx = 0; idx < _numberOfSegments; idx++)
     {
        LinearSegmentParameter x;
        x.unmarshal(dataStream);
        _linearSegmentParameters.push_back(x);
     }
}